

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O3

StatsPublisher *
anon_unknown.dwarf_19afe::createStatsPublisher(StatsPublisher *__return_storage_ptr__,Value *v)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  Value *v_00;
  string *__x;
  StatsPublisher *v_01;
  StatsPublisher *extraout_RAX;
  StatsPublisher *pSVar3;
  invalid_argument *this;
  string local_40;
  
  paVar1 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"bind","");
  v_00 = toml::Value::find(v,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (v_00 != (Value *)0x0) {
    (__return_storage_ptr__->bind).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __return_storage_ptr__->sendBuffer = 0;
    (__return_storage_ptr__->bind).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->bind).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    __x = toml::Value::
          ValueConverter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::to((ValueConverter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_40,v_00);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&__return_storage_ptr__->bind,__x);
    local_40._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"send_buffer","");
    v_01 = (StatsPublisher *)toml::Value::find(v,&local_40);
    pSVar3 = v_01;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      pSVar3 = extraout_RAX;
    }
    if (v_01 != (StatsPublisher *)0x0) {
      iVar2 = toml::Value::ValueConverter<int>::to((ValueConverter<int> *)&local_40,(Value *)v_01);
      pSVar3 = (StatsPublisher *)(long)iVar2;
      __return_storage_ptr__->sendBuffer = (size_t)pSVar3;
    }
    return pSVar3;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Expected publisher section to have \"bind\" key");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Config::StatsPublisher createStatsPublisher(const toml::Value& v) {
  auto bind = v.find("bind");
  if (!bind) {
    throw std::invalid_argument(
        "Expected publisher section to have \"bind\" key");
  }

  Config::StatsPublisher out;
  out.bind.push_back(bind->as<std::string>());

  // Optional send buffer size
  auto sendBuffer = v.find("send_buffer");
  if (sendBuffer) {
    out.sendBuffer = sendBuffer->as<int>();
  }

  return out;
}